

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O3

void __thiscall qpdf::Stream::setDictDescription(Stream *this)

{
  QPDFObject *this_00;
  QPDF *owning_qpdf;
  bool bVar1;
  Members *pMVar2;
  long *plVar3;
  size_type *psVar4;
  string local_58;
  string local_38;
  
  pMVar2 = stream(this);
  bVar1 = QPDFObjectHandle::hasObjectDescription(&pMVar2->stream_dict);
  if (!bVar1) {
    this_00 = (this->super_BaseHandle).obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    owning_qpdf = this_00->qpdf;
    QPDFObject::getDescription_abi_cxx11_(&local_38,this_00);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_38);
    psVar4 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_58.field_2._M_allocated_capacity = *psVar4;
      local_58.field_2._8_8_ = plVar3[3];
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    }
    else {
      local_58.field_2._M_allocated_capacity = *psVar4;
      local_58._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_58._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    QPDFObjectHandle::setObjectDescription(&pMVar2->stream_dict,owning_qpdf,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void
qpdf::Stream::setDictDescription()
{
    auto s = stream();
    if (!s->stream_dict.hasObjectDescription()) {
        s->stream_dict.setObjectDescription(
            obj->getQPDF(), obj->getDescription() + " -> stream dictionary");
    }
}